

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_codecvt.cpp
# Opt level: O0

void test_codecvt_conv(void)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  undefined8 uVar4;
  size_t sVar5;
  int j;
  int i;
  cvt_type *cvt;
  locale l;
  int in_stack_00000248;
  int in_stack_0000024c;
  cvt_type *in_stack_00000250;
  int in_stack_00000308;
  int in_stack_0000030c;
  cvt_type *in_stack_00000310;
  size_t in_stack_ffffffffffffff38;
  utf8_codecvt<wchar_t> *in_stack_ffffffffffffff40;
  string *in_stack_ffffffffffffff48;
  runtime_error *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  locale *in_stack_ffffffffffffff68;
  locale *in_stack_ffffffffffffff70;
  allocator *paVar6;
  int local_4c;
  int local_48;
  allocator local_41;
  string local_40 [32];
  codecvt *local_20;
  locale local_8;
  
  poVar3 = std::operator<<((ostream *)&std::cout,"Conversions ");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::locale::classic();
  operator_new(0x18);
  booster::locale::utf8_codecvt<wchar_t>::utf8_codecvt
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  std::locale::locale<booster::locale::utf8_codecvt<wchar_t>>
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
             (utf8_codecvt<wchar_t> *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60))
  ;
  local_20 = std::use_facet<std::codecvt<wchar_t,char,__mbstate_t>>(&local_8);
  test_counter = test_counter + 1;
  iVar2 = std::__codecvt_abstract_base<wchar_t,_char,___mbstate_t>::max_length
                    ((__codecvt_abstract_base<wchar_t,_char,___mbstate_t> *)0x107d69);
  if (iVar2 != 4) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x9a);
    poVar3 = std::operator<<(poVar3," cvt.max_length()==4");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    iVar2 = error_counter + 1;
    bVar1 = -1 < error_counter;
    error_counter = iVar2;
    if (bVar1) {
      uVar4 = __cxa_allocate_exception(0x30);
      paVar6 = &local_41;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_40,"Error limits reached, stopping unit test",paVar6);
      booster::runtime_error::runtime_error(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      __cxa_throw(uVar4,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  local_48 = 1;
  while (iVar2 = local_48, sVar5 = strlen(utf8_name), iVar2 <= (int)sVar5 + 1) {
    local_4c = 1;
    while (iVar2 = local_4c, sVar5 = wcslen(wide_name), iVar2 <= (int)sVar5 + 1) {
      test_codecvt_in_n_m(in_stack_00000310,in_stack_0000030c,in_stack_00000308);
      test_codecvt_out_n_m(in_stack_00000250,in_stack_0000024c,in_stack_00000248);
      local_4c = local_4c + 1;
    }
    local_48 = local_48 + 1;
  }
  std::locale::~locale(&local_8);
  return;
}

Assistant:

void test_codecvt_conv()
{
    std::cout << "Conversions " << std::endl;
    std::locale l(std::locale::classic(),new booster::locale::utf8_codecvt<wchar_t>());
 
    cvt_type const &cvt = std::use_facet<cvt_type>(l);

    TEST(cvt.max_length()==4);
    
    for(int i=1;i<=(int)strlen(utf8_name)+1;i++) {
        for(int j=1;j<=(int)wcslen(wide_name)+1;j++) {
            try {
                test_codecvt_in_n_m(cvt,i,j);
                test_codecvt_out_n_m(cvt,i,j);
            }
            catch(...) {
                std::cerr << "Wlen=" <<j << " Nlen=" << i << std::endl;
                throw;
            }
        }
    }    
}